

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

WitnessSize __thiscall miniscript::Node<XOnlyPubKey>::CalcWitnessSize(Node<XOnlyPubKey> *this)

{
  byte bVar1;
  char cVar2;
  MiniscriptContext MVar3;
  pointer psVar4;
  element_type *peVar5;
  element_type *peVar6;
  bool bVar7;
  bool bVar8;
  pointer pMVar9;
  pointer pMVar10;
  uint uVar11;
  MaxInt<unsigned_int> MVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  byte bVar19;
  byte bVar20;
  pointer psVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  MaxInt<unsigned_int> MVar25;
  ulong uVar26;
  long in_FS_OFFSET;
  bool bVar27;
  WitnessSize WVar28;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  ret;
  MaxInt<unsigned_int> local_80;
  MaxInt<unsigned_int> local_78;
  pointer pMStack_70;
  pointer local_68;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar3 = this->m_script_ctx;
  uVar11 = 0x49;
  if (MVar3 != P2WSH) {
    if (MVar3 != TAPSCRIPT) goto LAB_0071c035;
    uVar11 = 0x42;
  }
  iVar14 = 0x22;
  if (MVar3 != P2WSH) {
    if (MVar3 != TAPSCRIPT) {
LAB_0071c035:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    iVar14 = 0x21;
  }
  MVar12.value = 0;
  MVar12._0_4_ = this->fragment;
  MVar25.valid = true;
  MVar25._1_3_ = 0;
  MVar25.value = 0;
  switch(MVar12) {
  case (MaxInt<unsigned_int>)0x0:
    break;
  case (MaxInt<unsigned_int>)0x1:
  case (MaxInt<unsigned_int>)0x4:
  case (MaxInt<unsigned_int>)0x5:
    MVar12.valid = true;
    MVar12._1_3_ = 0;
    MVar12.value = 0;
    goto LAB_0071bec1;
  case (MaxInt<unsigned_int>)0x2:
    MVar25.valid = true;
    MVar25._1_3_ = 0;
    MVar25.value = 1;
    goto LAB_0071be19;
  case (MaxInt<unsigned_int>)0x3:
    MVar12 = (MaxInt<unsigned_int>)(((ulong)(uVar11 + iVar14) << 0x20) + 1);
    MVar25 = (MaxInt<unsigned_int>)(((ulong)(iVar14 + 1) << 0x20) + 1);
    break;
  case (MaxInt<unsigned_int>)0x6:
  case (MaxInt<unsigned_int>)0x7:
  case (MaxInt<unsigned_int>)0x8:
  case (MaxInt<unsigned_int>)0x9:
    MVar12.valid = true;
    MVar12._1_3_ = 0;
    MVar12.value = 0x21;
    goto LAB_0071bec1;
  case (MaxInt<unsigned_int>)0xa:
  case (MaxInt<unsigned_int>)0xb:
  case (MaxInt<unsigned_int>)0xc:
  case (MaxInt<unsigned_int>)0x10:
    peVar5 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    MVar12 = (peVar5->ws).sat;
    MVar25 = *(MaxInt<unsigned_int> *)((long)&peVar5->ws + 8);
    break;
  case (MaxInt<unsigned_int>)0xd:
    peVar5 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar27 = (peVar5->ws).sat.valid != '\x01';
    if (bVar27) {
      uVar23 = 0;
    }
    else {
      uVar23 = (ulong)(*(uint *)((long)&peVar5->ws + 4) + 2) << 0x20;
    }
    MVar12 = (MaxInt<unsigned_int>)(uVar23 | !bVar27);
    MVar25.valid = true;
    MVar25._1_3_ = 0;
    MVar25.value = 1;
    break;
  case (MaxInt<unsigned_int>)0xe:
    MVar12 = (((((this->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->ws).sat;
    goto LAB_0071bec1;
  case (MaxInt<unsigned_int>)0xf:
    MVar25.valid = true;
    MVar25._1_3_ = 0;
    MVar25.value = 1;
    MVar12 = (((((this->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->ws).sat;
    break;
  case (MaxInt<unsigned_int>)0x11:
    psVar21 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar21->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (((peVar5->ws).sat.valid == '\x01') &&
       (peVar6 = psVar21[1].
                 super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr, (peVar6->ws).sat.valid == '\x01')) {
      uVar16 = (ulong)(*(uint *)((long)&peVar6->ws + 4) + *(uint *)((long)&peVar5->ws + 4)) << 0x20;
      uVar23 = 1;
    }
    else {
      uVar16 = 0;
      uVar23 = 0;
    }
    MVar12 = (MaxInt<unsigned_int>)(uVar16 | uVar23);
    goto LAB_0071bec1;
  case (MaxInt<unsigned_int>)0x12:
    psVar21 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar21->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar6 = psVar21[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((peVar5->ws).sat.valid == '\x01') && ((peVar6->ws).sat.valid == '\x01')) {
      uVar23 = (ulong)(*(uint *)((long)&peVar6->ws + 4) + *(uint *)((long)&peVar5->ws + 4)) << 0x20;
      uVar16 = 1;
    }
    else {
      uVar23 = 0;
      uVar16 = 0;
    }
    if ((((MaxInt<unsigned_int> *)((long)&peVar5->ws + 8))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid == true)) {
      uVar13 = (ulong)(*(uint *)((long)&peVar6->ws + 0xc) + *(uint *)((long)&peVar5->ws + 0xc)) <<
               0x20;
      uVar17 = 1;
    }
    else {
      uVar13 = 0;
      uVar17 = 0;
    }
    MVar25 = (MaxInt<unsigned_int>)(uVar13 | uVar17);
    MVar12 = (MaxInt<unsigned_int>)(uVar16 | uVar23);
    break;
  case (MaxInt<unsigned_int>)0x13:
    psVar21 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar21->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar6 = psVar21[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    cVar2 = ((MaxInt<unsigned_int> *)((long)&peVar5->ws + 8))->valid;
    uVar11 = 0;
    uVar18 = 0;
    bVar27 = false;
    if (cVar2 == '\x01') {
      uVar18 = 0;
      bVar27 = false;
      if ((peVar6->ws).sat.valid == '\x01') {
        uVar18 = *(uint *)((long)&peVar6->ws + 4) + *(uint *)((long)&peVar5->ws + 0xc);
        bVar27 = true;
      }
    }
    bVar8 = false;
    if (((peVar5->ws).sat.valid == '\x01') &&
       (uVar11 = 0, ((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid == true)) {
      uVar11 = *(uint *)((long)&peVar6->ws + 0xc) + *(uint *)((long)&peVar5->ws + 4);
      bVar8 = true;
    }
    bVar7 = bVar8;
    uVar15 = uVar11;
    if ((bVar27) && (bVar7 = bVar27, uVar15 = uVar18, bVar8 != false)) {
      if (uVar11 < uVar18) {
        uVar11 = uVar18;
      }
      bVar7 = true;
      uVar15 = uVar11;
    }
    if ((cVar2 == '\0') || (((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid != true)) {
      uVar16 = 0;
      uVar23 = 0;
    }
    else {
      uVar16 = (ulong)(*(uint *)((long)&peVar6->ws + 0xc) + *(uint *)((long)&peVar5->ws + 0xc)) <<
               0x20;
      uVar23 = 1;
    }
    MVar25 = (MaxInt<unsigned_int>)(uVar16 | uVar23);
    MVar12 = (MaxInt<unsigned_int>)((ulong)uVar15 << 0x20 | (ulong)bVar7);
    break;
  case (MaxInt<unsigned_int>)0x14:
    psVar21 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar21->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar23 = 0;
    bVar27 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar5->ws + 8))->valid == true) {
      peVar6 = psVar21[1].
               super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar23 = 0;
      bVar27 = false;
      if ((peVar6->ws).sat.valid == '\x01') {
        uVar23 = (ulong)(*(uint *)((long)&peVar6->ws + 4) + *(uint *)((long)&peVar5->ws + 0xc));
        bVar27 = true;
      }
    }
    if ((peVar5->ws).sat.valid == '\0') {
      uVar17 = (ulong)bVar27;
      uVar16 = uVar17;
    }
    else if (bVar27) {
      uVar11 = *(uint *)((long)&peVar5->ws + 4);
      if ((uint)uVar23 < uVar11) {
        uVar23 = (ulong)uVar11;
      }
      uVar17 = 1;
      uVar16 = 0;
    }
    else {
      uVar16 = *(ulong *)&(peVar5->ws).sat;
      uVar23 = uVar16 >> 0x20;
      uVar17 = uVar16 & 0xff;
    }
    MVar12 = (MaxInt<unsigned_int>)((ulong)((uint)uVar16 & 0xffffff00) | uVar23 << 0x20 | uVar17);
LAB_0071bec1:
    MVar25.valid = false;
    MVar25._1_3_ = 0;
    MVar25.value = 0;
    break;
  case (MaxInt<unsigned_int>)0x15:
    psVar21 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar21->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar6 = psVar21[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    cVar2 = ((MaxInt<unsigned_int> *)((long)&peVar5->ws + 8))->valid;
    uVar23 = 0;
    bVar27 = false;
    if (cVar2 == '\x01') {
      uVar23 = 0;
      bVar27 = false;
      if ((peVar6->ws).sat.valid == '\x01') {
        uVar23 = (ulong)(*(uint *)((long)&peVar6->ws + 4) + *(uint *)((long)&peVar5->ws + 0xc));
        bVar27 = true;
      }
    }
    if ((peVar5->ws).sat.valid == '\0') {
      uVar16 = (ulong)bVar27;
      uVar17 = uVar16;
    }
    else if (bVar27) {
      uVar11 = *(uint *)((long)&peVar5->ws + 4);
      if ((uint)uVar23 < uVar11) {
        uVar23 = (ulong)uVar11;
      }
      uVar16 = 0;
      uVar17 = 1;
    }
    else {
      uVar16 = *(ulong *)&(peVar5->ws).sat;
      uVar23 = uVar16 >> 0x20;
      uVar17 = uVar16 & 0xff;
    }
    if ((cVar2 == '\0') || (((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid != true)) {
      uVar26 = 0;
      uVar13 = 0;
    }
    else {
      uVar26 = (ulong)(*(uint *)((long)&peVar6->ws + 0xc) + *(uint *)((long)&peVar5->ws + 0xc)) <<
               0x20;
      uVar13 = 1;
    }
    MVar25 = (MaxInt<unsigned_int>)(uVar26 | uVar13);
    MVar12 = (MaxInt<unsigned_int>)((ulong)((uint)uVar16 & 0xffffff00) | uVar23 << 0x20 | uVar17);
    break;
  case (MaxInt<unsigned_int>)0x16:
    psVar21 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar21->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar1 = (peVar5->ws).sat.valid;
    uVar11 = 0;
    uVar18 = 0;
    if (bVar1 == 1) {
      uVar18 = *(uint *)((long)&peVar5->ws + 4) + 2;
    }
    peVar6 = psVar21[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    bVar27 = (peVar6->ws).sat.valid == '\x01';
    if (bVar27) {
      uVar11 = *(uint *)((long)&peVar6->ws + 4) + 1;
    }
    bVar19 = bVar27;
    uVar15 = uVar11;
    if ((bVar1 != 0) && (bVar19 = bVar1, uVar15 = uVar18, bVar27)) {
      if (uVar11 < uVar18) {
        uVar11 = uVar18;
      }
      bVar19 = 1;
      uVar15 = uVar11;
    }
    bVar1 = ((MaxInt<unsigned_int> *)((long)&peVar5->ws + 8))->valid;
    uVar11 = 0;
    uVar18 = 0;
    if (bVar1 == 1) {
      uVar18 = *(uint *)((long)&peVar5->ws + 0xc) + 2;
    }
    bVar27 = ((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid == true;
    if (bVar27) {
      uVar11 = *(uint *)((long)&peVar6->ws + 0xc) + 1;
    }
    bVar20 = bVar27;
    uVar22 = uVar11;
    if ((bVar1 != 0) && (bVar20 = bVar1, uVar22 = uVar18, bVar27)) {
      if (uVar11 < uVar18) {
        uVar11 = uVar18;
      }
      bVar20 = 1;
      uVar22 = uVar11;
    }
    MVar12 = (MaxInt<unsigned_int>)((ulong)uVar15 << 0x20 | (ulong)bVar19);
    MVar25 = (MaxInt<unsigned_int>)((ulong)uVar22 << 0x20 | (ulong)bVar20);
    break;
  case (MaxInt<unsigned_int>)0x17:
    psVar21 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar21->
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar11 = 0;
    uVar18 = 0;
    bVar27 = false;
    if ((peVar5->ws).sat.valid == '\x01') {
      peVar6 = psVar21[1].
               super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar18 = 0;
      bVar27 = false;
      if ((peVar6->ws).sat.valid == '\x01') {
        uVar18 = *(uint *)((long)&peVar6->ws + 4) + *(uint *)((long)&peVar5->ws + 4);
        bVar27 = true;
      }
    }
    peVar6 = psVar21[2].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    cVar2 = ((MaxInt<unsigned_int> *)((long)&peVar5->ws + 8))->valid;
    bVar8 = false;
    if ((cVar2 == '\x01') && (uVar11 = 0, (peVar6->ws).sat.valid == '\x01')) {
      uVar11 = *(uint *)((long)&peVar6->ws + 4) + *(uint *)((long)&peVar5->ws + 0xc);
      bVar8 = true;
    }
    bVar7 = bVar8;
    uVar15 = uVar11;
    if ((bVar27) && (bVar7 = bVar27, uVar15 = uVar18, bVar8 != false)) {
      if (uVar11 < uVar18) {
        uVar11 = uVar18;
      }
      bVar7 = true;
      uVar15 = uVar11;
    }
    if ((cVar2 == '\0') || (((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid != true)) {
      uVar16 = 0;
      uVar23 = 0;
    }
    else {
      uVar16 = (ulong)(*(uint *)((long)&peVar6->ws + 0xc) + *(uint *)((long)&peVar5->ws + 0xc)) <<
               0x20;
      uVar23 = 1;
    }
    MVar25 = (MaxInt<unsigned_int>)(uVar16 | uVar23);
    MVar12 = (MaxInt<unsigned_int>)((ulong)uVar15 << 0x20 | (ulong)bVar7);
    break;
  case (MaxInt<unsigned_int>)0x18:
    local_78.valid = true;
    local_78 = (MaxInt<unsigned_int>)((ulong)local_78 & 0xffffffff);
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::reserve(&local_58,1);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
    ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
              ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                *)&local_58,&local_78);
    psVar21 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar21 != psVar4) {
      do {
        if (((local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->valid == '\x01') &&
           (peVar5 = (psVar21->
                     super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr, (peVar5->ws).dsat.valid == true)) {
          uVar23 = (ulong)((peVar5->ws).dsat.value +
                          *(uint *)((long)local_58.
                                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4)) << 0x20;
          uVar16 = 1;
        }
        else {
          uVar23 = 0;
          uVar16 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar23 | uVar16);
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::reserve((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)&local_78,1);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        uVar23 = (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (8 < uVar23) {
          uVar16 = 1;
          do {
            peVar5 = (psVar21->
                     super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            uVar11 = 0;
            uVar18 = 0;
            bVar27 = false;
            if (((MaxInt<unsigned_int> *)
                ((long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16 * 8))->valid == true) {
              uVar18 = 0;
              bVar27 = false;
              if ((peVar5->ws).dsat.valid == true) {
                uVar18 = (peVar5->ws).dsat.value +
                         ((uint *)((long)local_58.
                                         super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4))[uVar16 * 2]
                ;
                bVar27 = true;
              }
            }
            bVar8 = false;
            if ((((MaxInt<unsigned_int> *)
                 ((long)local_58.
                        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + -8))[uVar16].valid == true) &&
               (uVar11 = 0, (peVar5->ws).sat.valid == true)) {
              uVar11 = (peVar5->ws).sat.value +
                       ((uint *)((long)local_58.
                                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + -4))[uVar16 * 2];
              bVar8 = true;
            }
            bVar7 = bVar8;
            uVar15 = uVar11;
            if ((bVar27) && (bVar7 = bVar27, uVar15 = uVar18, bVar8 != false)) {
              if (uVar11 < uVar18) {
                uVar11 = uVar18;
              }
              bVar7 = true;
              uVar15 = uVar11;
            }
            local_80 = (MaxInt<unsigned_int>)((ulong)uVar15 << 0x20 | (ulong)bVar7);
            std::
            vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
            ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                      ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                        *)&local_78,&local_80);
            uVar16 = uVar16 + 1;
            uVar23 = (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar16 < (ulong)((long)uVar23 >> 3));
        }
        if (((&((MaxInt<unsigned_int> *)
               ((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + -8))->valid)[uVar23] == true) &&
           (peVar5 = (psVar21->
                     super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr, (peVar5->ws).sat.valid == true)) {
          uVar16 = (ulong)((peVar5->ws).sat.value +
                          *(int *)((long)((long)local_58.
                                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + -4) +
                                  uVar23)) << 0x20;
          uVar23 = 1;
        }
        else {
          uVar16 = 0;
          uVar23 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar16 | uVar23);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        pMVar10 = local_58.
                  super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar9 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pMStack_70;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        if ((MaxInt<unsigned_int>)pMVar9 != (MaxInt<unsigned_int>)0x0) {
          operator_delete(pMVar9,(long)pMVar10 - (long)pMVar9);
        }
        if (local_78 != (MaxInt<unsigned_int>)0x0) {
          operator_delete((void *)local_78,(long)local_68 - (long)local_78);
        }
        psVar21 = psVar21 + 1;
      } while (psVar21 != psVar4);
    }
    if ((ulong)((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)this->k) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0x483,
                    "internal::WitnessSize miniscript::Node<XOnlyPubKey>::CalcWitnessSize() const [Key = XOnlyPubKey]"
                   );
    }
    MVar12 = *(MaxInt<unsigned_int> *)
              ((long)local_58.
                     super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (ulong)this->k * 8);
    MVar25 = *local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    operator_delete(local_58.
                    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    break;
  case (MaxInt<unsigned_int>)0x19:
    uVar11 = uVar11 * this->k + 1;
    lVar24 = (ulong)(this->k + 1) << 0x20;
    goto LAB_0071be16;
  case (MaxInt<unsigned_int>)0x1a:
    uVar23 = (long)(this->keys).super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->keys).super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar11 = (uVar11 - 1) * this->k + (int)(uVar23 >> 5);
    lVar24 = uVar23 * 0x8000000;
LAB_0071be16:
    MVar25 = (MaxInt<unsigned_int>)(lVar24 + 1);
LAB_0071be19:
    MVar12 = (MaxInt<unsigned_int>)(((ulong)uVar11 << 0x20) + 1);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x487,
                  "internal::WitnessSize miniscript::Node<XOnlyPubKey>::CalcWitnessSize() const [Key = XOnlyPubKey]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  WVar28.dsat = MVar25;
  WVar28.sat = MVar12;
  return WVar28;
}

Assistant:

internal::WitnessSize CalcWitnessSize() const {
        const uint32_t sig_size = IsTapscript(m_script_ctx) ? 1 + 65 : 1 + 72;
        const uint32_t pubkey_size = IsTapscript(m_script_ctx) ? 1 + 32 : 1 + 33;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, 0};
            case Fragment::JUST_1:
            case Fragment::OLDER:
            case Fragment::AFTER: return {0, {}};
            case Fragment::PK_K: return {sig_size, 1};
            case Fragment::PK_H: return {sig_size + pubkey_size, 1 + pubkey_size};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {1 + 32, {}};
            case Fragment::ANDOR: {
                const auto sat{(subs[0]->ws.sat + subs[1]->ws.sat) | (subs[0]->ws.dsat + subs[2]->ws.sat)};
                const auto dsat{subs[0]->ws.dsat + subs[2]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::AND_V: return {subs[0]->ws.sat + subs[1]->ws.sat, {}};
            case Fragment::AND_B: return {subs[0]->ws.sat + subs[1]->ws.sat, subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_B: {
                const auto sat{(subs[0]->ws.dsat + subs[1]->ws.sat) | (subs[0]->ws.sat + subs[1]->ws.dsat)};
                const auto dsat{subs[0]->ws.dsat + subs[1]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::OR_C: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), {}};
            case Fragment::OR_D: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_I: return {(subs[0]->ws.sat + 1 + 1) | (subs[1]->ws.sat + 1), (subs[0]->ws.dsat + 1 + 1) | (subs[1]->ws.dsat + 1)};
            case Fragment::MULTI: return {k * sig_size + 1, k + 1};
            case Fragment::MULTI_A: return {k * sig_size + static_cast<uint32_t>(keys.size()) - k, static_cast<uint32_t>(keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S:
            case Fragment::WRAP_C: return subs[0]->ws;
            case Fragment::WRAP_D: return {1 + 1 + subs[0]->ws.sat, 1};
            case Fragment::WRAP_V: return {subs[0]->ws.sat, {}};
            case Fragment::WRAP_J: return {subs[0]->ws.sat, 1};
            case Fragment::THRESH: {
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    auto next_sats = Vector(sats[0] + sub->ws.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ws.dsat) | (sats[j - 1] + sub->ws.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ws.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {sats[k], sats[0]};
            }
        }
        assert(false);
    }